

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

CURLcode Curl_ssl_setup_x509_store(Curl_cfilter *cf,Curl_easy *data,SSL_CTX *ssl_ctx)

{
  byte bVar1;
  curl_blob *pcVar2;
  char *pcVar3;
  curl_trc_feat *pcVar4;
  int iVar5;
  int iVar6;
  ssl_primary_config *psVar7;
  ssl_config_data *psVar8;
  undefined8 *puVar9;
  timediff_t tVar10;
  X509_STORE *pXVar11;
  BIO *bp;
  stack_st_X509_INFO *psVar12;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  char *pcVar13;
  void *pvVar14;
  long lVar15;
  char *pcVar16;
  byte bVar17;
  char *pcVar18;
  Curl_hash *h;
  int iVar19;
  CURLcode CVar20;
  bool bVar21;
  curltime cVar22;
  curltime newer;
  
  psVar7 = Curl_ssl_cf_get_primary_config(cf);
  psVar8 = Curl_ssl_cf_get_config(cf,data);
  bVar17 = 1;
  if (((((data->set).general_ssl.ca_cache_timeout != 0) && ((psVar7->field_0x79 & 1) != 0)) &&
      (psVar7->CApath == (char *)0x0)) &&
     ((psVar7->ca_info_blob == (curl_blob *)0x0 && ((psVar8->primary).CRLfile == (char *)0x0)))) {
    bVar17 = (psVar8->field_0xc0 & 0x40) >> 6;
  }
  if (data->multi == (Curl_multi *)0x0) {
    puVar9 = (undefined8 *)0x0;
  }
  else {
    puVar9 = (undefined8 *)Curl_hash_pick(&data->multi->proto_hash,"tls:ossl:x509:share",0x13);
  }
  if ((puVar9 == (undefined8 *)0x0) || (puVar9[1] == 0)) {
LAB_0016915c:
    pXVar11 = (X509_STORE *)0x0;
  }
  else {
    if (-1 < (data->set).general_ssl.ca_cache_timeout) {
      cVar22 = Curl_now();
      newer._12_4_ = 0;
      newer.tv_sec = SUB128(cVar22._0_12_,0);
      newer.tv_usec = SUB124(cVar22._0_12_,8);
      cVar22._12_4_ = 0;
      cVar22._0_12_ = *(undefined1 (*) [12])(puVar9 + 2);
      tVar10 = Curl_timediff(newer,cVar22);
      lVar15 = (long)(data->set).general_ssl.ca_cache_timeout;
      if (SBORROW8(tVar10,lVar15 * 1000) == tVar10 + lVar15 * -1000 < 0) goto LAB_0016915c;
    }
    psVar7 = Curl_ssl_cf_get_primary_config(cf);
    pcVar13 = (char *)*puVar9;
    if ((pcVar13 == (char *)0x0) || (psVar7->CAfile == (char *)0x0)) {
      bVar21 = pcVar13 == psVar7->CAfile;
    }
    else {
      iVar5 = strcmp(pcVar13,psVar7->CAfile);
      bVar21 = iVar5 == 0;
    }
    if (!bVar21) goto LAB_0016915c;
    pXVar11 = (X509_STORE *)puVar9[1];
  }
  if ((pXVar11 != (X509_STORE *)0x0 && bVar17 == 0) &&
     (iVar5 = X509_STORE_up_ref(pXVar11), iVar5 != 0)) {
    SSL_CTX_set_cert_store((SSL_CTX *)ssl_ctx,pXVar11);
    return CURLE_OK;
  }
  pXVar11 = SSL_CTX_get_cert_store((SSL_CTX *)ssl_ctx);
  psVar7 = Curl_ssl_cf_get_primary_config(cf);
  psVar8 = Curl_ssl_cf_get_config(cf,data);
  pcVar2 = psVar7->ca_info_blob;
  if (pcVar2 == (curl_blob *)0x0) {
    pcVar13 = psVar7->CAfile;
  }
  else {
    pcVar13 = (char *)0x0;
  }
  pcVar3 = psVar7->CApath;
  pcVar18 = (psVar8->primary).CRLfile;
  bVar1 = psVar7->field_0x79;
  if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) {
    pcVar4 = (data->state).feat;
    if (pcVar4 == (curl_trc_feat *)0x0) {
      if (cf != (Curl_cfilter *)0x0) goto LAB_00169213;
    }
    else if ((cf != (Curl_cfilter *)0x0) && (0 < pcVar4->log_level)) {
LAB_00169213:
      if (0 < cf->cft->log_level) {
        pcVar16 = "none";
        if (pcVar13 != (char *)0x0) {
          pcVar16 = pcVar13;
        }
        Curl_trc_cf_infof(data,cf,"populate_x509_store, path=%s, blob=%d",pcVar16,
                          (ulong)(pcVar2 != (curl_blob *)0x0));
      }
    }
  }
  if (pXVar11 == (X509_STORE *)0x0) {
    CVar20 = CURLE_OUT_OF_MEMORY;
    goto LAB_0016972d;
  }
  if ((bVar1 & 1) != 0) {
    if (pcVar2 != (curl_blob *)0x0) {
      CVar20 = CURLE_SSL_CACERT_BADFILE;
      if (pcVar2->len < 0x80000000) {
        bp = BIO_new_mem_buf(pcVar2->data,(int)pcVar2->len);
        if (bp == (BIO *)0x0) {
          CVar20 = CURLE_OUT_OF_MEMORY;
        }
        else {
          psVar12 = PEM_X509_INFO_read_bio
                              (bp,(stack_st_X509_INFO *)0x0,(undefined1 *)0x0,(void *)0x0);
          if (psVar12 == (stack_st_X509_INFO *)0x0) {
            CVar20 = CURLE_SSL_CACERT_BADFILE;
          }
          else {
            iVar5 = OPENSSL_sk_num(psVar12);
            if (iVar5 < 1) {
              CVar20 = CURLE_SSL_CACERT_BADFILE;
            }
            else {
              iVar5 = 0;
              iVar19 = 0;
              do {
                puVar9 = (undefined8 *)OPENSSL_sk_value(psVar12,iVar19);
                if ((X509 *)*puVar9 != (X509 *)0x0) {
                  iVar6 = X509_STORE_add_cert(pXVar11,(X509 *)*puVar9);
                  if (iVar6 != 0) {
                    iVar5 = iVar5 + 1;
                    goto LAB_00169333;
                  }
LAB_001693a3:
                  iVar5 = 0;
                  break;
                }
LAB_00169333:
                if ((X509_CRL *)puVar9[1] != (X509_CRL *)0x0) {
                  iVar6 = X509_STORE_add_crl(pXVar11,(X509_CRL *)puVar9[1]);
                  if (iVar6 == 0) goto LAB_001693a3;
                  iVar5 = iVar5 + 1;
                }
                iVar19 = iVar19 + 1;
                iVar6 = OPENSSL_sk_num(psVar12);
              } while (iVar19 < iVar6);
              CVar20 = CURLE_SSL_CACERT_BADFILE;
              if (0 < iVar5) {
                CVar20 = CURLE_OK;
              }
            }
            OPENSSL_sk_pop_free(psVar12,X509_INFO_free);
          }
          BIO_free(bp);
        }
      }
      if (CVar20 != CURLE_OK) {
        Curl_failf(data,"error importing CA certificate blob");
        goto LAB_0016972d;
      }
      if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
         ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))))
      {
        Curl_infof(data,"successfully imported CA certificate blob");
      }
    }
    if (pcVar13 != (char *)0x0 || pcVar3 != (char *)0x0) {
      if ((pcVar13 != (char *)0x0) && (iVar5 = X509_STORE_load_file(pXVar11,pcVar13), iVar5 == 0)) {
        if (pcVar2 != (curl_blob *)0x0) {
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
             ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
              (0 < pcVar4->log_level)))) {
            Curl_infof(data,"error setting certificate file, continuing anyway");
          }
          goto LAB_0016949f;
        }
        pcVar18 = "error setting certificate file: %s";
LAB_0016985a:
        Curl_failf(data,pcVar18,pcVar13);
        CVar20 = CURLE_SSL_CACERT_BADFILE;
        goto LAB_0016972d;
      }
LAB_0016949f:
      if ((pcVar3 != (char *)0x0) && (iVar5 = X509_STORE_load_path(pXVar11,pcVar3), iVar5 == 0)) {
        if (pcVar2 == (curl_blob *)0x0) {
          pcVar18 = "error setting certificate path: %s";
          pcVar13 = pcVar3;
          goto LAB_0016985a;
        }
        if (data == (Curl_easy *)0x0) goto LAB_00169610;
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))
           )) {
          Curl_infof(data,"error setting certificate path, continuing anyway");
        }
      }
      if (data != (Curl_easy *)0x0) {
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))
           )) {
          pcVar16 = "none";
          if (pcVar13 != (char *)0x0) {
            pcVar16 = pcVar13;
          }
          Curl_infof(data," CAfile: %s",pcVar16);
        }
        if ((((data->set).field_0x8cd & 0x10) != 0) &&
           ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))
           )) {
          pcVar13 = "none";
          if (pcVar3 != (char *)0x0) {
            pcVar13 = pcVar3;
          }
          Curl_infof(data," CApath: %s",pcVar13);
        }
      }
    }
  }
LAB_00169610:
  if (pcVar18 != (char *)0x0) {
    m = X509_LOOKUP_file();
    ctx = X509_STORE_add_lookup(pXVar11,m);
    if ((ctx == (X509_LOOKUP *)0x0) || (iVar5 = X509_load_crl_file(ctx,pcVar18,1), iVar5 == 0)) {
      Curl_failf(data,"error loading CRL file: %s",pcVar18);
      CVar20 = CURLE_SSL_CRL_BADFILE;
      goto LAB_0016972d;
    }
    if (data == (Curl_easy *)0x0) {
      X509_STORE_set_flags(pXVar11,0xc);
    }
    else {
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))))
      {
        Curl_infof(data,"successfully loaded CRL file:");
      }
      X509_STORE_set_flags(pXVar11,0xc);
      if ((((data->set).field_0x8cd & 0x10) != 0) &&
         ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))))
      {
        Curl_infof(data,"  CRLfile: %s",pcVar18);
      }
    }
  }
  CVar20 = CURLE_OK;
  if ((((bVar1 & 1) != 0) && (X509_STORE_set_flags(pXVar11,0x8000), pcVar18 == (char *)0x0)) &&
     ((psVar8->field_0xc0 & 0x10) == 0)) {
    X509_STORE_set_flags(pXVar11,0x80000);
  }
LAB_0016972d:
  if (CVar20 == CURLE_OK && bVar17 == 0) {
    psVar7 = Curl_ssl_cf_get_primary_config(cf);
    if (data->multi != (Curl_multi *)0x0) {
      h = &data->multi->proto_hash;
      puVar9 = (undefined8 *)Curl_hash_pick(h,"tls:ossl:x509:share",0x13);
      if (puVar9 == (undefined8 *)0x0) {
        puVar9 = (undefined8 *)(*Curl_ccalloc)(1,0x20);
        if (puVar9 == (undefined8 *)0x0) {
          return CVar20;
        }
        pvVar14 = Curl_hash_add2(h,"tls:ossl:x509:share",0x13,puVar9,oss_x509_share_free);
        if (pvVar14 == (void *)0x0) {
          (*Curl_cfree)(puVar9);
          return CVar20;
        }
      }
      iVar5 = X509_STORE_up_ref(pXVar11);
      if (iVar5 != 0) {
        if (psVar7->CAfile == (char *)0x0) {
          pcVar13 = (char *)0x0;
        }
        else {
          pcVar13 = (*Curl_cstrdup)(psVar7->CAfile);
          if (pcVar13 == (char *)0x0) {
            X509_STORE_free(pXVar11);
            return CVar20;
          }
        }
        if ((X509_STORE *)puVar9[1] != (X509_STORE *)0x0) {
          X509_STORE_free((X509_STORE *)puVar9[1]);
          (*Curl_cfree)((void *)*puVar9);
        }
        cVar22 = Curl_now();
        puVar9[2] = cVar22.tv_sec;
        *(int *)(puVar9 + 3) = cVar22.tv_usec;
        puVar9[1] = pXVar11;
        *puVar9 = pcVar13;
      }
    }
  }
  return CVar20;
}

Assistant:

CURLcode Curl_ssl_setup_x509_store(struct Curl_cfilter *cf,
                                   struct Curl_easy *data,
                                   SSL_CTX *ssl_ctx)
{
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  struct ssl_config_data *ssl_config = Curl_ssl_cf_get_config(cf, data);
  CURLcode result = CURLE_OK;
  X509_STORE *cached_store;
  bool cache_criteria_met;

  /* Consider the X509 store cacheable if it comes exclusively from a CAfile,
     or no source is provided and we are falling back to OpenSSL's built-in
     default. */
  cache_criteria_met = (data->set.general_ssl.ca_cache_timeout != 0) &&
    conn_config->verifypeer &&
    !conn_config->CApath &&
    !conn_config->ca_info_blob &&
    !ssl_config->primary.CRLfile &&
    !ssl_config->native_ca_store;

  cached_store = get_cached_x509_store(cf, data);
  if(cached_store && cache_criteria_met && X509_STORE_up_ref(cached_store)) {
    SSL_CTX_set_cert_store(ssl_ctx, cached_store);
  }
  else {
    X509_STORE *store = SSL_CTX_get_cert_store(ssl_ctx);

    result = populate_x509_store(cf, data, store);
    if(result == CURLE_OK && cache_criteria_met) {
      set_cached_x509_store(cf, data, store);
    }
  }

  return result;
}